

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlwrap.c
# Opt level: O1

void * override_GL_glXGetProcAddressARB(char *name)

{
  void *pvVar1;
  code *UNRECOVERED_JUMPTABLE;
  
  pvVar1 = wrapped_dlsym("GL",name);
  if (pvVar1 != (void *)0x0) {
    return pvVar1;
  }
  pvVar1 = dlwrap_real_dlopen("libGL.so.1",1);
  UNRECOVERED_JUMPTABLE = (code *)dlwrap_real_dlsym(pvVar1,"glXGetProcAddressARB");
  pvVar1 = (void *)(*UNRECOVERED_JUMPTABLE)(name);
  return pvVar1;
}

Assistant:

void *
override_GL_glXGetProcAddressARB(const char *name)
{
    void *symbol;

    symbol = wrapped_dlsym("GL", name);
    if (symbol)
        return symbol;

    return DEFER_TO_GL("libGL.so.1", override_GL_glXGetProcAddressARB,
                       "glXGetProcAddressARB", (name));
}